

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-avl.c
# Opt level: O0

void pp_tree_avl_balance_remove(PTreeAVLNode *node,PTreeBaseNode **root)

{
  int iVar1;
  PTreeBaseNode *pPVar2;
  PTreeAVLNode *pPVar3;
  pint sibling_balance;
  PTreeAVLNode *sibling;
  PTreeAVLNode *parent;
  PTreeBaseNode **root_local;
  PTreeAVLNode *node_local;
  
  root_local = (PTreeBaseNode **)node;
  do {
    pPVar2 = root_local[4];
    if (pPVar2 == (PTreeBaseNode *)0x0) {
      return;
    }
    if (pPVar2->left == (PTreeBaseNode_ *)root_local) {
      if (*(int *)&pPVar2[1].right == -1) {
        pPVar3 = (PTreeAVLNode *)pPVar2->right;
        iVar1 = pPVar3->balance_factor;
        if (pPVar3->balance_factor == 1) {
          pp_tree_avl_rotate_right_left(pPVar3,root);
        }
        else {
          pp_tree_avl_rotate_left(pPVar3,root);
        }
joined_r0x00122420:
        root_local = &pPVar2->left;
        if (iVar1 == 0) {
          return;
        }
      }
      else {
        if (*(int *)&pPVar2[1].right == 0) {
          *(undefined4 *)&pPVar2[1].right = 0xffffffff;
          return;
        }
        *(undefined4 *)&pPVar2[1].right = 0;
      }
    }
    else {
      if (*(int *)&pPVar2[1].right == 1) {
        pPVar3 = (PTreeAVLNode *)pPVar2->left;
        iVar1 = pPVar3->balance_factor;
        if (pPVar3->balance_factor == -1) {
          pp_tree_avl_rotate_left_right(pPVar3,root);
        }
        else {
          pp_tree_avl_rotate_right(pPVar3,root);
        }
        goto joined_r0x00122420;
      }
      if (*(int *)&pPVar2[1].right == 0) {
        *(undefined4 *)&pPVar2[1].right = 1;
        return;
      }
      *(undefined4 *)&pPVar2[1].right = 0;
    }
    root_local = &root_local[4]->left;
  } while( true );
}

Assistant:

static void
pp_tree_avl_balance_remove (PTreeAVLNode *node, PTreeBaseNode **root)
{
	PTreeAVLNode	*parent;
	PTreeAVLNode	*sibling;
	pint		sibling_balance;

	while (TRUE) {
		parent = node->parent;

		if (P_UNLIKELY (parent == NULL))
			break;

		if (parent->base.left == (PTreeBaseNode *) node) {
			if (parent->balance_factor == -1) {
				sibling         = (PTreeAVLNode *) parent->base.right;
				sibling_balance = sibling->balance_factor;

				if (sibling->balance_factor == 1)
					/* Case 1 */
					pp_tree_avl_rotate_right_left (sibling, root);
				else
					/* Case 2 */
					pp_tree_avl_rotate_left (sibling, root);

				node = parent;

				if (sibling_balance == 0)
					break;
			} else if (parent->balance_factor == 0) {
				/* Case 3 */
				parent->balance_factor = -1;
				break;
			} else
				/* Case 4 */
				parent->balance_factor = 0;
		} else {
			if (parent->balance_factor == 1) {
				sibling         = (PTreeAVLNode *) parent->base.left;
				sibling_balance = sibling->balance_factor;

				if (sibling->balance_factor == -1)
					/* Case 1 */
					pp_tree_avl_rotate_left_right (sibling, root);
				else
					/* Case 2 */
					pp_tree_avl_rotate_right (sibling, root);

				node = parent;

				if (sibling_balance == 0)
					break;
			} else if (parent->balance_factor == 0) {
				/* Case 3 */
				parent->balance_factor = 1;
				break;
			} else
				/* Case 4 */
				parent->balance_factor = 0;
		}

		node = node->parent;
	}
}